

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.cpp
# Opt level: O0

void __thiscall chatra::Scope::~Scope(Scope *this)

{
  anon_class_16_2_20c9cae2 process;
  bool bVar1;
  CapturedScope *this_00;
  Scope *local_50;
  lock_guard<chatra::SpinLock> local_48;
  lock_guard<chatra::SpinLock> lock;
  Reference local_28;
  Reference ref;
  CapturedScope *capturedScope;
  Scope *this_local;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->captured);
  if (bVar1) {
    ref = Scope::ref(this,CapturedScope);
    this_00 = Reference::derefWithoutLock<chatra::CapturedScope>(&ref);
    local_28 = Object::ref(&this_00->super_Object,CapturedScope);
    process.this = this;
    process.ref = &local_28;
    AsyncRead<std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>>
    ::read<chatra::Scope::~Scope()::__0>
              ((AsyncRead<std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>>
                *)this,process);
    AsyncRead<chatra::Scope*>::write<chatra::Scope::~write()::__1>
              ((AsyncRead<chatra::Scope*> *)&this_00->scope);
  }
  std::lock_guard<chatra::SpinLock>::lock_guard(&local_48,&this->storage->lockScopes);
  local_50 = this;
  std::
  unordered_set<chatra::Scope_*,_std::hash<chatra::Scope_*>,_std::equal_to<chatra::Scope_*>,_std::allocator<chatra::Scope_*>_>
  ::erase(&this->storage->scopes,&local_50);
  std::lock_guard<chatra::SpinLock>::~lock_guard(&local_48);
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::~vector(&this->nodes);
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::~vector(&this->groups);
  AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
  ::~AsyncRead(&this->
                super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
              );
  return;
}

Assistant:

Scope::~Scope() {
	if (captured) {
		auto& capturedScope = this->ref(StringId::CapturedScope).derefWithoutLock<CapturedScope>();
		auto ref = capturedScope.ref(StringId::CapturedScope);
		read([&](const RefsContainer& refs) {
			ref.allocateWithoutLock<Object>(TypeId::CapturedScopeObject, std::move(groups), std::move(nodes), refs);
		});
		capturedScope.scope.write([](Scope*& scope) { scope = nullptr; });
	}

	{
		std::lock_guard<SpinLock> lock(storage.lockScopes);

		// Checking readCount outside lockScopes would be unsafe
		// because garbage collector may increment readCount asynchronously inside lockScopes
		chatra_assert(getReadCount() == 0);

		storage.scopes.erase(this);
	}
}